

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

int canvas_path_iterate(_glist *x,t_canvas_path_iterator fun,void *user_data)

{
  char *__src;
  int iVar1;
  int iVar2;
  _canvasenvironment *p_Var3;
  size_t sVar4;
  _glist *x_00;
  char *pcVar5;
  t_namelist *ptVar6;
  int unaff_R14D;
  int iVar7;
  char realname [1000];
  char local_418 [997];
  undefined1 local_33;
  undefined1 local_31;
  
  if (fun == (t_canvas_path_iterator)0x0) {
    iVar7 = 0;
  }
  else {
    if (x == (_glist *)0x0) {
      iVar7 = 0;
    }
    else {
      iVar7 = 0;
      x_00 = x;
      do {
        iVar1 = unaff_R14D;
        if (x_00->gl_env != (_canvasenvironment *)0x0) {
          p_Var3 = canvas_getenv(x_00);
          pcVar5 = p_Var3->ce_dir->s_name;
          ptVar6 = (t_namelist *)&x_00->gl_env->ce_path;
          iVar1 = iVar7;
          do {
            iVar7 = iVar1;
            ptVar6 = ptVar6->nl_next;
            iVar1 = unaff_R14D;
            if (ptVar6 == (t_namelist *)0x0) break;
            iVar1 = sys_isabsolutepath(ptVar6->nl_string);
            if (iVar1 == 0) {
              strncpy(local_418,pcVar5,1000);
              local_33 = 0;
              sVar4 = strlen(local_418);
              (local_418 + sVar4)[0] = '/';
              (local_418 + sVar4)[1] = '\0';
            }
            else {
              local_418[0] = '\0';
            }
            __src = ptVar6->nl_string;
            sVar4 = strlen(local_418);
            strncat(local_418,__src,1000 - sVar4);
            local_31 = 0;
            iVar2 = (*fun)(local_418,user_data);
            iVar1 = iVar7 + 1;
          } while (iVar2 != 0);
          if (ptVar6 != (t_namelist *)0x0) {
            return iVar1;
          }
        }
        x_00 = x_00->gl_owner;
        unaff_R14D = iVar1;
      } while (x_00 != (_glist *)0x0);
    }
    if (x == (_glist *)0x0) {
      pcVar5 = ".";
    }
    else {
      p_Var3 = canvas_getenv(x);
      pcVar5 = p_Var3->ce_dir->s_name;
    }
    iVar1 = (*fun)(pcVar5,user_data);
    if (iVar1 == 0) {
      iVar7 = iVar7 + 1;
    }
    else {
      ptVar6 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_searchpath;
      iVar1 = iVar7 + 2;
      do {
        iVar7 = iVar1;
        ptVar6 = ptVar6->nl_next;
        if (ptVar6 == (t_namelist *)0x0) {
          ptVar6 = (pd_maininstance.pd_stuff)->st_temppath;
          while( true ) {
            if (ptVar6 == (t_namelist *)0x0) {
              if (sys_usestdpath == 0) {
                return iVar7 + -1;
              }
              ptVar6 = (pd_maininstance.pd_stuff)->st_staticpath;
              iVar1 = iVar7 + -1;
              while( true ) {
                if (ptVar6 == (t_namelist *)0x0) {
                  return iVar1;
                }
                iVar1 = (*fun)(ptVar6->nl_string,user_data);
                if (iVar1 == 0) break;
                ptVar6 = ptVar6->nl_next;
                iVar1 = iVar7;
                iVar7 = iVar7 + 1;
              }
              return iVar7;
            }
            iVar1 = (*fun)(ptVar6->nl_string,user_data);
            if (iVar1 == 0) break;
            ptVar6 = ptVar6->nl_next;
            iVar7 = iVar7 + 1;
          }
          return iVar7;
        }
        iVar2 = (*fun)(ptVar6->nl_string,user_data);
        iVar1 = iVar7 + 1;
      } while (iVar2 != 0);
    }
  }
  return iVar7;
}

Assistant:

int canvas_path_iterate(const t_canvas *x, t_canvas_path_iterator fun,
    void *user_data)
{
    const t_canvas *y = 0;
    t_namelist *nl = 0;
    int count = 0;
    if (!fun)
        return 0;
        /* iterate through canvas-local paths */
    for (y = x; y; y = y->gl_owner)
        if (y->gl_env)
    {
        const char *dir;
        dir = canvas_getdir(y)->s_name;
        for (nl = y->gl_env->ce_path; nl; nl = nl->nl_next)
        {
            char realname[MAXPDSTRING];
            if (sys_isabsolutepath(nl->nl_string))
                realname[0] = '\0';
            else
            {   /* if not absolute path, append Pd lib dir */
                strncpy(realname, dir, MAXPDSTRING);
                realname[MAXPDSTRING-3] = 0;
                strcat(realname, "/");
            }
            strncat(realname, nl->nl_string, MAXPDSTRING-strlen(realname));
            realname[MAXPDSTRING-1] = 0;
            if (!fun(realname, user_data))
                return count+1;
            count++;
        }
    }
    /* try canvas dir */
    if (!fun((x ? canvas_getdir(x)->s_name : "."), user_data))
        return count+1;
    count++;

    /* now iterate through the global paths */
    for (nl = STUFF->st_searchpath; nl; nl = nl->nl_next)
    {
        if (!fun(nl->nl_string, user_data))
            return count+1;
        count++;
    }
    /* and the temp paths from the commandline */
    for (nl = STUFF->st_temppath; nl; nl = nl->nl_next)
    {
        if (!fun(nl->nl_string, user_data))
            return count+1;
        count++;
    }
    /* and the default paths */
    if (sys_usestdpath)
        for (nl = STUFF->st_staticpath; nl; nl = nl->nl_next)
        {
            if (!fun(nl->nl_string, user_data))
                return count+1;
            count++;
        }

    return count;
}